

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::insert(QTextDocumentPrivate *this,int pos,QStringView str,int format)

{
  qsizetype qVar1;
  
  if (str.m_size != 0) {
    qVar1 = (this->text).d.size;
    QString::append((QChar *)&this->text,(longlong)str.m_data);
    insert(this,pos,(int)qVar1,(int)str.m_size,format);
    return;
  }
  return;
}

Assistant:

void QTextDocumentPrivate::insert(int pos, QStringView str, int format)
{
    if (str.size() == 0)
        return;

    Q_ASSERT(noBlockInString(str));

    int strPos = text.size();
    text.append(str);
    insert(pos, strPos, str.size(), format);
}